

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unqlite.c
# Opt level: O0

sxi32 ArchiveHashGetEntry(SyArchive *pArch,char *zName,sxu32 nLen,SyArchiveEntry **ppEntry)

{
  sxu32 sVar1;
  sxi32 sVar2;
  undefined1 auStack_48 [4];
  sxu32 nHash;
  SyString sEntry;
  SyArchiveEntry *pBucketEntry;
  SyArchiveEntry **ppEntry_local;
  sxu32 nLen_local;
  char *zName_local;
  SyArchive *pArch_local;
  
  sVar1 = (*pArch->xHash)(zName,nLen);
  sEntry._8_8_ = pArch->apHash[sVar1 & pArch->nSize - 1];
  _auStack_48 = zName;
  sEntry.zString._0_4_ = nLen;
  while( true ) {
    if (sEntry._8_8_ == 0) {
      return -6;
    }
    if ((sVar1 == *(sxu32 *)(sEntry._8_8_ + 0x90)) &&
       (sVar2 = (*pArch->xCmp)((SyString *)auStack_48,(SyString *)(sEntry._8_8_ + 0x50)), sVar2 == 0
       )) break;
    sEntry._8_8_ = *(undefined8 *)(sEntry._8_8_ + 0x68);
  }
  if (ppEntry != (SyArchiveEntry **)0x0) {
    *ppEntry = (SyArchiveEntry *)sEntry._8_8_;
  }
  return 0;
}

Assistant:

static sxi32 ArchiveHashGetEntry(SyArchive *pArch, const char *zName, sxu32 nLen, SyArchiveEntry **ppEntry)
{
	SyArchiveEntry *pBucketEntry;
	SyString sEntry;
	sxu32 nHash;

	nHash = pArch->xHash(zName, nLen);
	pBucketEntry = pArch->apHash[nHash & (pArch->nSize - 1)];

	SyStringInitFromBuf(&sEntry, zName, nLen);

	for(;;){
		if( pBucketEntry == 0 ){
			break;
		}
		if( nHash == pBucketEntry->nHash && pArch->xCmp(&sEntry, &pBucketEntry->sFileName) == 0 ){
			if( ppEntry ){
				*ppEntry = pBucketEntry;
			}
			return SXRET_OK;
		}
		pBucketEntry = pBucketEntry->pNextHash;
	}
	return SXERR_NOTFOUND;
}